

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

bool __thiscall graph::isEdge(graph *this,restaurant *from,restaurant *to)

{
  unordered_map<restaurant_*,_int,_std::hash<restaurant_*>,_std::equal_to<restaurant_*>,_std::allocator<std::pair<restaurant_*const,_int>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  int iVar2;
  mapped_type *pmVar3;
  mapped_type *__x;
  _Base_ptr p_Var4;
  ulong uVar5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  ulong uVar8;
  bool bVar9;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> adj;
  restaurant *local_50;
  restaurant *local_48;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_40;
  
  this_00 = &this->mapper;
  local_50 = to;
  local_48 = from;
  pmVar3 = std::__detail::
           _Map_base<restaurant_*,_std::pair<restaurant_*const,_int>,_std::allocator<std::pair<restaurant_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<restaurant_*>,_std::hash<restaurant_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<restaurant_*,_std::pair<restaurant_*const,_int>,_std::allocator<std::pair<restaurant_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<restaurant_*>,_std::hash<restaurant_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_48);
  p_Var6 = (this->v)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->v)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = &p_Var1->_M_header;
  if (p_Var6 != (_Base_ptr)0x0) {
    do {
      if (*pmVar3 <= (int)p_Var6[1]._M_color) {
        p_Var4 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < *pmVar3];
    } while (p_Var6 != (_Base_ptr)0x0);
  }
  p_Var6 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) && (p_Var6 = p_Var4, *pmVar3 < (int)p_Var4[1]._M_color))
  {
    p_Var6 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    pmVar3 = std::__detail::
             _Map_base<restaurant_*,_std::pair<restaurant_*const,_int>,_std::allocator<std::pair<restaurant_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<restaurant_*>,_std::hash<restaurant_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<restaurant_*,_std::pair<restaurant_*const,_int>,_std::allocator<std::pair<restaurant_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<restaurant_*>,_std::hash<restaurant_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,&local_50);
    p_Var6 = (this->v)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var4 = &p_Var1->_M_header;
    if (p_Var6 != (_Base_ptr)0x0) {
      do {
        if (*pmVar3 <= (int)*(size_t *)(p_Var6 + 1)) {
          p_Var4 = p_Var6;
        }
        p_Var6 = (&p_Var6->_M_left)[(int)*(size_t *)(p_Var6 + 1) < *pmVar3];
      } while (p_Var6 != (_Base_ptr)0x0);
    }
    p_Var7 = p_Var1;
    if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
       (p_Var7 = (_Rb_tree_header *)p_Var4,
       *pmVar3 < (int)((_Rb_tree_header *)p_Var4)->_M_node_count)) {
      p_Var7 = p_Var1;
    }
    if (p_Var7 != p_Var1) {
      pmVar3 = std::__detail::
               _Map_base<restaurant_*,_std::pair<restaurant_*const,_int>,_std::allocator<std::pair<restaurant_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<restaurant_*>,_std::hash<restaurant_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<restaurant_*,_std::pair<restaurant_*const,_int>,_std::allocator<std::pair<restaurant_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<restaurant_*>,_std::hash<restaurant_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,&local_48);
      __x = std::__detail::
            _Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<int,_std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this,pmVar3);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector(&local_40,__x)
      ;
      bVar9 = local_40.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_finish !=
              local_40.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start;
      if (bVar9) {
        uVar8 = 0;
        do {
          iVar2 = local_40.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar8].first;
          pmVar3 = std::__detail::
                   _Map_base<restaurant_*,_std::pair<restaurant_*const,_int>,_std::allocator<std::pair<restaurant_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<restaurant_*>,_std::hash<restaurant_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<restaurant_*,_std::pair<restaurant_*const,_int>,_std::allocator<std::pair<restaurant_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<restaurant_*>,_std::hash<restaurant_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)this_00,&local_50);
          if (iVar2 == *pmVar3) break;
          uVar8 = uVar8 + 1;
          uVar5 = (long)local_40.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_40.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3;
          bVar9 = uVar8 < uVar5;
        } while (uVar8 < uVar5);
      }
      if (local_40.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        return bVar9;
      }
      operator_delete(local_40.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      return bVar9;
    }
  }
  return false;
}

Assistant:

bool graph::isEdge(restaurant *from, restaurant *to)
{
    if (v.find(mapper[from]) == v.end() || v.find(mapper[to]) == v.end())
    {
        return false;
    }
    vector<pair<int, int>> adj = theGraph[mapper[from]];
    for (int i = 0; i < adj.size(); i++)
    {
        if (adj[i].first == mapper[to])
        {
            return true;
        }
    }
    return false;
}